

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O2

bool __thiscall
PrintVisitor::needParentheses(PrintVisitor *this,Expression *expression,OperatorChar op)

{
  CalculationEngine *this_00;
  bool bVar1;
  byte bVar2;
  OperatorChar opChar;
  int iVar3;
  int iVar4;
  BinaryOperatorExpression *this_01;
  bool bVar5;
  Operator nodeOperator;
  Operator inputOperator;
  Operator local_c0;
  Operator local_70;
  
  if (expression == (Expression *)0x0) {
    return false;
  }
  bVar5 = false;
  this_01 = (BinaryOperatorExpression *)
            __dynamic_cast(expression,&Expression::typeinfo,&BinaryOperatorExpression::typeinfo,0);
  if (this_01 == (BinaryOperatorExpression *)0x0) {
    return false;
  }
  Operator::Operator(&local_70);
  Operator::Operator(&local_c0);
  bVar1 = CalculationEngine::getBinaryOperator(this->mCalcEngine,op,&local_70);
  if (bVar1) {
    this_00 = this->mCalcEngine;
    opChar = BinaryOperatorExpression::op(this_01);
    bVar1 = CalculationEngine::getBinaryOperator(this_00,opChar,&local_c0);
    if (bVar1) {
      iVar3 = Operator::precedence(&local_70);
      iVar4 = Operator::precedence(&local_c0);
      bVar5 = iVar4 < iVar3;
      bVar2 = 1;
      goto LAB_00134fe1;
    }
  }
  bVar2 = 0;
LAB_00134fe1:
  Operator::~Operator(&local_c0);
  Operator::~Operator(&local_70);
  return (bool)(bVar5 & bVar2);
}

Assistant:

bool PrintVisitor::needParentheses(Expression* expression, OperatorChar op) {
	if (auto binaryOperatorExpression = dynamic_cast<BinaryOperatorExpression*>(expression)) {
		Operator inputOperator;
		Operator nodeOperator;
		if (mCalcEngine.getBinaryOperator(op, inputOperator)
			&& mCalcEngine.getBinaryOperator(binaryOperatorExpression->op(), nodeOperator)) {
			return inputOperator.precedence() > nodeOperator.precedence();
		}
	}

	return false;
}